

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc_string.c
# Opt level: O0

char gstr_cmp(char *a,char *b)

{
  bool bVar1;
  char *local_20;
  char *b_local;
  char *a_local;
  
  local_20 = b;
  b_local = a;
  while( true ) {
    bVar1 = false;
    if (*b_local == *local_20) {
      bVar1 = *b_local != '\0';
    }
    if (!bVar1) break;
    b_local = b_local + 1;
    local_20 = local_20 + 1;
  }
  return *b_local == *local_20;
}

Assistant:

char gstr_cmp(const char *a,const char *b)
{
	while(*a==*b && *a)
		++a,++b;
	if(*a==*b)
		return 1;
	else
		return 0;
}